

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtabbar.cpp
# Opt level: O3

int __thiscall QTabBarPrivate::selectNewCurrentIndexFrom(QTabBarPrivate *this,int fromIndex)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (this->tabList).d.size;
  uVar4 = (ulong)fromIndex;
  iVar3 = -1;
  if ((long)uVar4 < (long)uVar1) {
    do {
      if ((uVar4 < uVar1) && ((~(this->tabList).d.ptr[uVar4]->field_0xe4 & 3) == 0)) {
        iVar3 = (int)uVar4;
        if (-1 < (long)uVar4) {
          return iVar3;
        }
        break;
      }
      uVar4 = uVar4 + 1;
    } while ((long)uVar4 < (long)uVar1);
  }
  if (0 < fromIndex) {
    uVar4 = (ulong)(uint)fromIndex;
    do {
      if ((uVar4 - 1 < uVar1) && ((~(this->tabList).d.ptr[uVar4 - 1]->field_0xe4 & 3) == 0)) {
        return (int)uVar4 + -1;
      }
      bVar2 = 1 < uVar4;
      uVar4 = uVar4 - 1;
    } while (bVar2);
  }
  return iVar3;
}

Assistant:

int QTabBarPrivate::selectNewCurrentIndexFrom(int fromIndex)
{
    int newindex = -1;
    for (int i = fromIndex; i < tabList.size(); ++i) {
        if (at(i)->visible && at(i)->enabled) {
          newindex = i;
          break;
        }
    }
    if (newindex < 0) {
        for (int i = fromIndex-1; i > -1; --i) {
            if (at(i)->visible && at(i)->enabled) {
              newindex = i;
              break;
            }
        }
    }

    return newindex;
}